

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O0

int MPIABI_Testany(int count,MPIABI_Request *array_of_requests,int *indx,int *flag,
                  MPIABI_StatusPtr status)

{
  int iVar1;
  MPI_Status *pMVar2;
  WPI_StatusPtr local_48 [2];
  MPIABI_Request *pMStack_38;
  int ierr;
  MPI_Request *reqs;
  MPIABI_StatusPtr status_local;
  int *flag_local;
  int *indx_local;
  MPIABI_Request *array_of_requests_local;
  int count_local;
  
  pMStack_38 = array_of_requests;
  reqs = (MPI_Request *)status;
  status_local = (MPIABI_StatusPtr)flag;
  flag_local = indx;
  indx_local = (int *)array_of_requests;
  array_of_requests_local._4_4_ = count;
  WPI_StatusPtr::WPI_StatusPtr(local_48,status);
  pMVar2 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(local_48);
  iVar1 = MPI_Testany(count,array_of_requests,indx,flag,pMVar2);
  WPI_StatusPtr::~WPI_StatusPtr(local_48);
  return iVar1;
}

Assistant:

int MPIABI_Testany(int count, MPIABI_Request array_of_requests[],
                              int *indx, int *flag, MPIABI_StatusPtr status) {
  MPI_Request *const reqs = (MPI_Request *)(void *)array_of_requests;
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = 0; i < count; ++i)
      reqs[i] = (WPI_Request)array_of_requests[i];
  const int ierr = MPI_Testany(count, reqs, indx, flag, (WPI_StatusPtr)status);
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = count - 1; i >= 0; --i)
      array_of_requests[i] = (WPI_Request)reqs[i];
  return ierr;
}